

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb::BitpackingCompressionState<unsigned_char,_true,_signed_char>::BitpackingWriter::
     WriteDeltaFor(uchar *values,bool *validity,bitpacking_width_t width,uchar frame_of_reference,
                  char delta_offset,uchar *original_values,idx_t count,void *data_ptr)

{
  long lVar1;
  idx_t iVar2;
  data_ptr_t dst;
  
  iVar2 = BitpackingPrimitives::GetRequiredSize(count,width);
  ReserveSpace((BitpackingCompressionState<unsigned_char,_true,_signed_char> *)data_ptr,iVar2 + 3);
  WriteMetaData((BitpackingCompressionState<unsigned_char,_true,_signed_char> *)data_ptr,DELTA_FOR);
  **(uchar **)((long)data_ptr + 0x40) = frame_of_reference;
  lVar1 = *(long *)((long)data_ptr + 0x40);
  *(long *)((long)data_ptr + 0x40) = lVar1 + 1;
  *(bitpacking_width_t *)(lVar1 + 1) = width;
  lVar1 = *(long *)((long)data_ptr + 0x40);
  *(long *)((long)data_ptr + 0x40) = lVar1 + 1;
  *(char *)(lVar1 + 1) = delta_offset;
  dst = (data_ptr_t)(*(long *)((long)data_ptr + 0x40) + 1);
  *(data_ptr_t *)((long)data_ptr + 0x40) = dst;
  BitpackingPrimitives::PackBuffer<unsigned_char,false>(dst,values,count,width);
  *(long *)((long)data_ptr + 0x40) = *(long *)((long)data_ptr + 0x40) + iVar2;
  UpdateStats((BitpackingCompressionState<unsigned_char,_true,_signed_char> *)data_ptr,count);
  return;
}

Assistant:

static void WriteDeltaFor(T *values, bool *validity, bitpacking_width_t width, T frame_of_reference,
		                          T_S delta_offset, T *original_values, idx_t count, void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			auto bp_size = BitpackingPrimitives::GetRequiredSize(count, width);
			ReserveSpace(state, bp_size + 3 * sizeof(T));

			WriteMetaData(state, BitpackingMode::DELTA_FOR);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, static_cast<T>(width));
			WriteData(state->data_ptr, delta_offset);

			BitpackingPrimitives::PackBuffer<T, false>(state->data_ptr, values, count, width);
			state->data_ptr += bp_size;

			UpdateStats(state, count);
		}